

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-messages-react.c
# Opt level: O2

_Bool borg_react_prompted(char *buf,keypress *key,wchar_t x,wchar_t y)

{
  bool bVar1;
  _Bool _Var2;
  keycode_t kVar3;
  int iVar4;
  char *pcVar5;
  bool bVar6;
  
  if (x < L'\x04' || y != L'\0') {
LAB_002234b5:
    bVar6 = y != L'\0';
    bVar1 = x < L'\f';
    if (bVar1 || bVar6) {
      if (y == L'\0') goto LAB_00223510;
    }
    else {
      _Var2 = prefix(buf,"(Equip: c-d,");
      if (_Var2) {
        key->code = 99;
        if (*borg_cfg != 0) {
          borg_note("# Putting ring on the left hand.");
          return true;
        }
        return true;
      }
LAB_00223510:
      kVar3 = borg_inkey(false);
      if (((L'\t' < x) && (kVar3 == 0)) && (iVar4 = strncmp(buf,"Direction",9), iVar4 == 0)) {
        if (borg_confirm_target != true) {
          borg_note("** UNEXPECTED REQUEST FOR DIRECTION Dumping keypress history ***");
          pcVar5 = format("** line starting <%s> ***",buf);
          borg_note(pcVar5);
          borg_dump_recent_keys(L'\x14');
          borg_oops("unexpected request for direction");
          key->code = 0xe000;
          return true;
        }
        if (*borg_cfg != 0) {
          borg_note("# Expected request for Direction.");
        }
        borg_confirm_target = false;
        kVar3 = borg_get_queued_direction();
        key->code = kVar3;
        goto LAB_0022373c;
      }
      if ((!bVar1 && !bVar6) && (_Var2 = prefix(buf,"You have no room"), _Var2)) {
        if (*borg_cfg != 0) {
          borg_note("# \'You have no room\' is a no-op");
        }
        key->code = 0;
        return true;
      }
    }
    kVar3 = borg_inkey(false);
    if ((y == L'\x01' && kVar3 == 0) && (_Var2 = prefix(buf,"Which effect?"), _Var2)) {
      if (*borg_cfg != 0) {
        borg_note("# Use of unknown object with multiple effects");
      }
      key->code = 0x61;
LAB_0022373c:
      return key != (keypress *)0x0;
    }
    kVar3 = borg_inkey(false);
    if ((kVar3 == 0) && (_Var2 = prefix(buf,"Choose a monster race (by symbol) to banish"), _Var2))
    {
      if (*borg_cfg != 0) {
        borg_note("# Use of Wonder selected BANISHMENT");
      }
      key->code = 0xe000;
      goto LAB_0022373c;
    }
    if ((bVar1 || bVar6) ||
       ((_Var2 = prefix(buf,"The lava will"), !_Var2 &&
        (_Var2 = prefix(buf,"Lava blocks y"), !_Var2)))) {
      kVar3 = borg_inkey(false);
      if ((L'\v' < x) &&
         ((kVar3 == 0 && y == L'\0' && (_Var2 = prefix(buf,"Set recall depth"), _Var2)))) {
        if (*borg_cfg != 0) {
          borg_note("# Use of unknown object with recall");
        }
LAB_00223755:
        key->code = 0x6e;
        return true;
      }
      if (x < L'\f' || y != L'\x01') {
        if (x < L'\f') {
          return false;
        }
      }
      else {
        _Var2 = prefix(buf,"Throw which item? (Throw");
        if (_Var2) {
          if (*borg_cfg != 0) {
            borg_note("# switching to inventory for throws");
          }
          key->code = 0x2f;
          return true;
        }
      }
      _Var2 = prefix(buf,"Target out of range");
      if (!_Var2) {
        return false;
      }
      goto LAB_0022364c;
    }
    if (*borg_cfg == 0) goto LAB_0022364c;
    pcVar5 = "# ignoring Lava warning";
  }
  else {
    _Var2 = prefix(buf,"Die?");
    if ((_Var2) && (borg_cheat_death == true)) {
      borg_parse((char *)0x0);
      borg_flush();
      borg_note("# Cheating death...");
      if ((borg_cfg[0x1d] <= borg.trait[0x23]) ||
         (pcVar5 = strstr(player->died_from,"starvation"), pcVar5 != (char *)0x0)) {
        borg_write_map(false);
      }
      borg_log_death();
      borg_log_death_data();
      if (borg_cfg[0x12] == 0) {
        reincarnate_borg();
        borg_respawning = 7;
      }
      else {
        do_cmd_wiz_cure_all((command *)0x0);
      }
      goto LAB_00223755;
    }
    _Var2 = prefix(buf,"Atte");
    if (!_Var2) goto LAB_002234b5;
    if (*borg_cfg == 0) goto LAB_0022364c;
    pcVar5 = "# Confirming use of Spell/Prayer when low on mana.";
  }
  borg_note(pcVar5);
LAB_0022364c:
  key->code = 0x79;
  return true;
}

Assistant:

bool borg_react_prompted(const char* buf, struct keypress *key, int x, int y)
{
    /* Mega-Hack -- Catch "Die? [y/n]" messages */
    /* If there is text on the first line... */
    /* And the game does not want a command... */
    /* And the cursor is on the top line... */
    /* And the text acquired above is "Die?" */
    if (y == 0 && x >= 4 && prefix(buf, "Die?") && borg_cheat_death) {
        /* Flush messages */
        borg_parse(NULL);

        /* flush the buffer */
        borg_flush();

        /* Take note */
        borg_note("# Cheating death...");

        /* Dump the Character Map*/
        if (borg.trait[BI_CLEVEL] >= borg_cfg[BORG_DUMP_LEVEL]
            || strstr(player->died_from, "starvation"))
            borg_write_map(false);

        /* Log the death */
        borg_log_death();
        borg_log_death_data();

#if 0
        /* Note the score */
        borg_enter_score();
#endif

        if (!borg_cfg[BORG_CHEAT_DEATH]) {
            reincarnate_borg();
            borg_respawning = 7;
        }
        else
            do_cmd_wiz_cure_all(0);

        key->code = 'n';
        return true;
    }

    /* with 292, there is a flush(0, 0, 0) introduced as it asks for
     * confirmation. This flush is messing up the borg.  This will allow the
     * borg to work around the flush Attempt to catch "Attempt it anyway? [y/n]"
     */
    if (y == 0 && x >= 4 && prefix(buf, "Atte")) {
        /* Return the confirmation */
        if (borg_cfg[BORG_VERBOSE])
            borg_note("# Confirming use of Spell/Prayer when low on mana.");
        key->code = 'y';
        return true;
    }

    /* Wearing two rings.  Place this on the left hand */
    if (y == 0 && x >= 12 && (prefix(buf, "(Equip: c-d,"))) {
        /* Left hand */
        key->code = 'c';
        if (borg_cfg[BORG_VERBOSE])
            borg_note("# Putting ring on the left hand.");
        return true;
    }
    /*
     * This frequently catches when the key queue has become messed up
     * The borg will press a key and get a "Direction?" type prompt and 
     * not be expecting it. The borg should halt in that case so the bad 
     * code can be found and cleaned up.
     */
    if (y == 0 && !borg_inkey(false)
        && (x >= 10) && strncmp(buf, "Direction", 9) == 0) {
        if (borg_confirm_target) {
            if (borg_cfg[BORG_VERBOSE])
                borg_note("# Expected request for Direction.");
            /* reset the flag */
            borg_confirm_target = false;
            /* Return queued target */
            key->code = borg_get_queued_direction();
            return key;
        }
        else {
            borg_note("** UNEXPECTED REQUEST FOR DIRECTION Dumping keypress history ***");
            borg_note(format("** line starting <%s> ***", buf));
            borg_dump_recent_keys(20);
            borg_oops("unexpected request for direction");
            /* Hack -- Escape */
            key->code = ESCAPE;
            return true;
        }
    }

    /* Stepping on a stack when the inventory is full gives a message */
    /* and the keypress when given this message is requeued so the borg */
    /* thinks it is a user keypress when it isn't */
    if (y == 0 && x >= 12 && (prefix(buf, "You have no room"))) {
        if (borg_cfg[BORG_VERBOSE])
            borg_note("# 'You have no room' is a no-op");
        /* key code 0 seems to be a no-op and ignored as a user keypress */
        key->code = 0;
        return true;
    }

    /* ***MEGA-HACK***  */
    /* This will be hit if the borg uses an unidentified effect that has */
    /* EF_SELECT/multiple effects. Always pick "one of the following at */
    /* random" when the item is used post ID, an effect will be selected */
    if (!borg_inkey(false) && y == 1 && prefix(buf, "Which effect?")) {
        if (borg_cfg[BORG_VERBOSE])
            borg_note("# Use of unknown object with multiple effects");
        /* the first selection (a) is random */
        key->code = 'a';
        return key;
    }

    /* This will be hit if the borg uses am item with the WONDER effect and */
    /* it picks banishment.  Always just escape out. Banishment is too */
    /* dangerous to randomly pick */
    if (!borg_inkey(false)
        && prefix(buf, "Choose a monster race (by symbol) to banish")) {
        if (borg_cfg[BORG_VERBOSE])
            borg_note("# Use of Wonder selected BANISHMENT");
        key->code = ESCAPE;
        return key;
    }

    /* prompt for stepping in lava.  This should be avoided but */
    /* if the borg is stuck, give him a pass */
    if (y == 0 && x >= 12
        && (prefix(buf, "The lava will") || prefix(buf, "Lava blocks y"))) {
        if (borg_cfg[BORG_VERBOSE])
            borg_note("# ignoring Lava warning");
        /* yes step in */
        key->code = 'y';
        return true;
    }

    /* prompt for recall depth */
    if (!borg_inkey(false) && y == 0 && x >= 12
        && prefix(buf, "Set recall depth")) {
        if (borg_cfg[BORG_VERBOSE])
            borg_note("# Use of unknown object with recall");
        /* the first selection (a) is random */
        key->code = 'n';
        return true;
    }

    /* make sure inventory is used for throwing */
    if (y == 1 && x >= 12 && (prefix(buf, "Throw which item? (Throw"))) {
        if (borg_cfg[BORG_VERBOSE])
            borg_note("# switching to inventory for throws");
        /* yes step in */
        key->code = '/';
        return true;
    }

    /* Sometimes the borg will overshoot the range limit of his shooter */
    if (x >= 12 && (prefix(buf, "Target out of range"))) {
        /* Fire Anyway? [Y/N] */
        /* yes step in */
        key->code = 'y';
        return true;
    }


    return false;
}